

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

void __thiscall KokkosTools::SpaceTimeStack::StackNode::adopt(StackNode *this)

{
  _Base_ptr p_Var1;
  
  if (this->kind != STACK_REGION) {
    this->total_kokkos_runtime = this->total_runtime + this->total_kokkos_runtime;
  }
  for (p_Var1 = (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->children)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    adopt((StackNode *)(p_Var1 + 1));
    this->total_kokkos_runtime = (double)p_Var1[4]._M_parent + this->total_kokkos_runtime;
    this->total_number_of_kernel_calls =
         (long)&(p_Var1[5]._M_parent)->_M_color + this->total_number_of_kernel_calls;
  }
  if (0.0 <= this->total_kokkos_runtime) {
    return;
  }
  __assert_fail("this->total_kokkos_runtime >= 0.",
                "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp"
                ,0xd8,"void KokkosTools::SpaceTimeStack::StackNode::adopt()");
}

Assistant:

void adopt() {
    if (this->kind != STACK_REGION) {
      this->total_kokkos_runtime += this->total_runtime;
    }
    for (auto& child : this->children) {
      const_cast<StackNode&>(child).adopt();
      this->total_kokkos_runtime += child.total_kokkos_runtime;
      this->total_number_of_kernel_calls += child.total_number_of_kernel_calls;
    }
    assert(this->total_kokkos_runtime >= 0.);
  }